

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O0

void __thiscall QFbCursor::changeCursor(QFbCursor *this,QCursor *widgetCursor,QWindow *window)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  QFbCursor *in_RSI;
  QFbCursor *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  CursorShape shape;
  QPoint mScreenOffset;
  QPoint spot;
  undefined4 in_stack_ffffffffffffff38;
  CursorShape in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  QFbCursor *pQVar5;
  QRect *in_stack_ffffffffffffff78;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  QPoint local_58;
  QRect local_50;
  QPixmap local_40 [24];
  QImage local_28 [24];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->mVisible & 1U) != 0) {
    pQVar5 = in_RDI;
    if (in_RSI == (QFbCursor *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = QCursor::shape();
    }
    if (iVar2 == 0x18) {
      local_10 = 0xaaaaaaaaaaaaaaaa;
      local_10 = QCursor::hotSpot();
      QCursor::pixmap();
      QPixmap::toImage();
      iVar3 = QPoint::x((QPoint *)0x1207f8);
      QPoint::y((QPoint *)0x120809);
      setCursor(in_RDI,(QImage *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffff44,
                in_stack_ffffffffffffff40);
      QImage::~QImage(local_28);
      QPixmap::~QPixmap(local_40);
    }
    else {
      setCursor((QFbCursor *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                in_stack_ffffffffffffff3c);
    }
    QVar4 = getCurrentRect(in_RSI);
    local_50._0_8_ = QVar4._0_8_;
    (in_RDI->mCurrentRect).x1 = (Representation)local_50.x1.m_i;
    (in_RDI->mCurrentRect).y1 = (Representation)local_50.y1.m_i;
    local_50._8_8_ = QVar4._8_8_;
    (in_RDI->mCurrentRect).x2 = (Representation)local_50.x2.m_i;
    (in_RDI->mCurrentRect).y2 = (Representation)local_50.y2.m_i;
    local_58.xp.m_i = -0x55555556;
    local_58.yp.m_i = -0x55555556;
    local_50 = QVar4;
    local_68 = (**(code **)(*(long *)in_RDI->mScreen + 0x68))();
    local_58 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                             );
    bVar1 = 1;
    if ((in_RDI->mOnScreen & 1U) == 0) {
      local_78 = (**(code **)(*(long *)in_RDI->mScreen + 0x68))();
      QRect::translated(in_stack_ffffffffffffff78,(QPoint *)pQVar5);
      bVar1 = QRect::intersects((QRect *)local_78);
    }
    if ((bVar1 & 1) != 0) {
      (**(code **)(*(long *)in_RDI + 0xa0))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFbCursor::changeCursor(QCursor * widgetCursor, QWindow *window)
{
    Q_UNUSED(window);
    if (!mVisible)
        return;
    const Qt::CursorShape shape = widgetCursor ? widgetCursor->shape() : Qt::ArrowCursor;

    if (shape == Qt::BitmapCursor) {
        // application supplied cursor
        QPoint spot = widgetCursor->hotSpot();
        setCursor(widgetCursor->pixmap().toImage(), spot.x(), spot.y());
    } else {
        // system cursor
        setCursor(shape);
    }
    mCurrentRect = getCurrentRect();
    QPoint mScreenOffset = mScreen->geometry().topLeft(); // global to local translation
    if (mOnScreen || mScreen->geometry().intersects(mCurrentRect.translated(mScreenOffset)))
        setDirty();
}